

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyagg_impl.h
# Opt level: O2

int secp256k1_musig_pubkey_agg
              (secp256k1_context *ctx,secp256k1_xonly_pubkey *agg_pk,
              secp256k1_musig_keyagg_cache *keyagg_cache,secp256k1_pubkey **pubkeys,size_t n_pubkeys
              )

{
  secp256k1_pubkey *pubkey;
  int iVar1;
  long lVar2;
  long lVar3;
  undefined8 uVar4;
  secp256k1_ge *psVar5;
  void *pvVar6;
  secp256k1_ge *psVar7;
  secp256k1_keyagg_cache_internal *psVar8;
  uint64_t *puVar9;
  char *pcVar10;
  size_t sVar11;
  byte bVar12;
  secp256k1_ge pkp;
  secp256k1_musig_pubkey_agg_ecmult_data ecmult_data;
  secp256k1_ge pk;
  uint64_t local_178 [13];
  uchar local_110 [8];
  uchar auStack_108 [8];
  uchar local_100 [8];
  uchar auStack_f8 [8];
  uint64_t local_f0;
  uint64_t uStack_e8;
  uint64_t local_e0;
  uint64_t uStack_d8;
  undefined8 local_d0;
  secp256k1_gej pkj;
  
  bVar12 = 0;
  if (ctx == (secp256k1_context *)0x0) {
    pcVar10 = "test condition failed: ctx != NULL";
    uVar4 = 0xb5;
LAB_00108e43:
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/modules/musig/keyagg_impl.h"
            ,uVar4,pcVar10);
    abort();
  }
  if (agg_pk != (secp256k1_xonly_pubkey *)0x0) {
    agg_pk->data[0x30] = '\0';
    agg_pk->data[0x31] = '\0';
    agg_pk->data[0x32] = '\0';
    agg_pk->data[0x33] = '\0';
    agg_pk->data[0x34] = '\0';
    agg_pk->data[0x35] = '\0';
    agg_pk->data[0x36] = '\0';
    agg_pk->data[0x37] = '\0';
    agg_pk->data[0x38] = '\0';
    agg_pk->data[0x39] = '\0';
    agg_pk->data[0x3a] = '\0';
    agg_pk->data[0x3b] = '\0';
    agg_pk->data[0x3c] = '\0';
    agg_pk->data[0x3d] = '\0';
    agg_pk->data[0x3e] = '\0';
    agg_pk->data[0x3f] = '\0';
    agg_pk->data[0x20] = '\0';
    agg_pk->data[0x21] = '\0';
    agg_pk->data[0x22] = '\0';
    agg_pk->data[0x23] = '\0';
    agg_pk->data[0x24] = '\0';
    agg_pk->data[0x25] = '\0';
    agg_pk->data[0x26] = '\0';
    agg_pk->data[0x27] = '\0';
    agg_pk->data[0x28] = '\0';
    agg_pk->data[0x29] = '\0';
    agg_pk->data[0x2a] = '\0';
    agg_pk->data[0x2b] = '\0';
    agg_pk->data[0x2c] = '\0';
    agg_pk->data[0x2d] = '\0';
    agg_pk->data[0x2e] = '\0';
    agg_pk->data[0x2f] = '\0';
    agg_pk->data[0x10] = '\0';
    agg_pk->data[0x11] = '\0';
    agg_pk->data[0x12] = '\0';
    agg_pk->data[0x13] = '\0';
    agg_pk->data[0x14] = '\0';
    agg_pk->data[0x15] = '\0';
    agg_pk->data[0x16] = '\0';
    agg_pk->data[0x17] = '\0';
    agg_pk->data[0x18] = '\0';
    agg_pk->data[0x19] = '\0';
    agg_pk->data[0x1a] = '\0';
    agg_pk->data[0x1b] = '\0';
    agg_pk->data[0x1c] = '\0';
    agg_pk->data[0x1d] = '\0';
    agg_pk->data[0x1e] = '\0';
    agg_pk->data[0x1f] = '\0';
    agg_pk->data[0] = '\0';
    agg_pk->data[1] = '\0';
    agg_pk->data[2] = '\0';
    agg_pk->data[3] = '\0';
    agg_pk->data[4] = '\0';
    agg_pk->data[5] = '\0';
    agg_pk->data[6] = '\0';
    agg_pk->data[7] = '\0';
    agg_pk->data[8] = '\0';
    agg_pk->data[9] = '\0';
    agg_pk->data[10] = '\0';
    agg_pk->data[0xb] = '\0';
    agg_pk->data[0xc] = '\0';
    agg_pk->data[0xd] = '\0';
    agg_pk->data[0xe] = '\0';
    agg_pk->data[0xf] = '\0';
  }
  if (pubkeys == (secp256k1_pubkey **)0x0) {
    pvVar6 = (ctx->illegal_callback).data;
    pcVar10 = "pubkeys != NULL";
  }
  else {
    if (n_pubkeys != 0) {
      ecmult_data.ctx = ctx;
      ecmult_data.pks = pubkeys;
      secp256k1_ge_set_infinity(&ecmult_data.second_pk);
      sVar11 = 1;
      do {
        if (n_pubkeys == sVar11) goto LAB_00108c80;
        pubkey = pubkeys[sVar11];
        iVar1 = secp256k1_memcmp_var(*pubkeys,pubkey,0x40);
        sVar11 = sVar11 + 1;
      } while (iVar1 == 0);
      iVar1 = secp256k1_pubkey_load(ctx,&pk,pubkey);
      if (iVar1 == 0) {
        return 0;
      }
      psVar5 = &pk;
      psVar7 = &ecmult_data.second_pk;
      for (lVar2 = 0xd; lVar2 != 0; lVar2 = lVar2 + -1) {
        (psVar7->x).n[0] = (psVar5->x).n[0];
        psVar5 = (secp256k1_ge *)((long)psVar5 + (ulong)bVar12 * -0x10 + 8);
        psVar7 = (secp256k1_ge *)((long)psVar7 + (ulong)bVar12 * -0x10 + 8);
      }
LAB_00108c80:
      secp256k1_musig_keyagglist_sha256((secp256k1_sha256 *)&pk);
      for (sVar11 = 0; n_pubkeys != sVar11; sVar11 = sVar11 + 1) {
        pkp.x.n[0] = 0x21;
        iVar1 = secp256k1_ec_pubkey_serialize
                          (ctx,(uchar *)&pkj,(size_t *)&pkp,pubkeys[sVar11],0x102);
        if (iVar1 == 0) {
          return 0;
        }
        if (pkp.x.n[0] != 0x21) {
          pcVar10 = "test condition failed: ser_len == sizeof(ser)";
          uVar4 = 0x5a;
          goto LAB_00108e43;
        }
        secp256k1_sha256_write((secp256k1_sha256 *)&pk,(uchar *)&pkj,0x21);
      }
      secp256k1_sha256_finalize((secp256k1_sha256 *)&pk,ecmult_data.pks_hash);
      iVar1 = secp256k1_ecmult_multi_var
                        (&ctx->error_callback,(secp256k1_scratch *)0x0,&pkj,(secp256k1_scalar *)0x0,
                         secp256k1_musig_pubkey_agg_callback,&ecmult_data,n_pubkeys);
      if (iVar1 == 0) {
        return 0;
      }
      secp256k1_ge_set_gej(&pkp,&pkj);
      secp256k1_fe_normalize_var(&pkp.y);
      iVar1 = secp256k1_ge_is_infinity(&pkp);
      if (iVar1 == 0) {
        if (keyagg_cache != (secp256k1_musig_keyagg_cache *)0x0) {
          lVar2 = 0xd;
          psVar5 = &pkp;
          psVar8 = (secp256k1_keyagg_cache_internal *)&pk;
          for (lVar3 = lVar2; lVar3 != 0; lVar3 = lVar3 + -1) {
            (psVar8->pk).x.n[0] = (psVar5->x).n[0];
            psVar5 = (secp256k1_ge *)((long)psVar5 + (ulong)bVar12 * -0x10 + 8);
            psVar8 = (secp256k1_keyagg_cache_internal *)((long)psVar8 + (ulong)bVar12 * -0x10 + 8);
          }
          psVar5 = &ecmult_data.second_pk;
          puVar9 = local_178;
          for (; lVar2 != 0; lVar2 = lVar2 + -1) {
            *puVar9 = (psVar5->x).n[0];
            psVar5 = (secp256k1_ge *)((long)psVar5 + (ulong)bVar12 * -0x10 + 8);
            puVar9 = puVar9 + (ulong)bVar12 * -2 + 1;
          }
          local_e0 = 0;
          uStack_d8 = 0;
          local_f0 = 0;
          uStack_e8 = 0;
          local_d0._0_4_ = 0;
          local_d0._4_4_ = 0;
          local_110[0] = ecmult_data.pks_hash[0];
          local_110[1] = ecmult_data.pks_hash[1];
          local_110[2] = ecmult_data.pks_hash[2];
          local_110[3] = ecmult_data.pks_hash[3];
          local_110[4] = ecmult_data.pks_hash[4];
          local_110[5] = ecmult_data.pks_hash[5];
          local_110[6] = ecmult_data.pks_hash[6];
          local_110[7] = ecmult_data.pks_hash[7];
          auStack_108[0] = ecmult_data.pks_hash[8];
          auStack_108[1] = ecmult_data.pks_hash[9];
          auStack_108[2] = ecmult_data.pks_hash[10];
          auStack_108[3] = ecmult_data.pks_hash[0xb];
          auStack_108[4] = ecmult_data.pks_hash[0xc];
          auStack_108[5] = ecmult_data.pks_hash[0xd];
          auStack_108[6] = ecmult_data.pks_hash[0xe];
          auStack_108[7] = ecmult_data.pks_hash[0xf];
          local_100[0] = ecmult_data.pks_hash[0x10];
          local_100[1] = ecmult_data.pks_hash[0x11];
          local_100[2] = ecmult_data.pks_hash[0x12];
          local_100[3] = ecmult_data.pks_hash[0x13];
          local_100[4] = ecmult_data.pks_hash[0x14];
          local_100[5] = ecmult_data.pks_hash[0x15];
          local_100[6] = ecmult_data.pks_hash[0x16];
          local_100[7] = ecmult_data.pks_hash[0x17];
          auStack_f8[0] = ecmult_data.pks_hash[0x18];
          auStack_f8[1] = ecmult_data.pks_hash[0x19];
          auStack_f8[2] = ecmult_data.pks_hash[0x1a];
          auStack_f8[3] = ecmult_data.pks_hash[0x1b];
          auStack_f8[4] = ecmult_data.pks_hash[0x1c];
          auStack_f8[5] = ecmult_data.pks_hash[0x1d];
          auStack_f8[6] = ecmult_data.pks_hash[0x1e];
          auStack_f8[7] = ecmult_data.pks_hash[0x1f];
          secp256k1_keyagg_cache_save(keyagg_cache,(secp256k1_keyagg_cache_internal *)&pk);
        }
        if (agg_pk != (secp256k1_xonly_pubkey *)0x0) {
          secp256k1_extrakeys_ge_even_y(&pkp);
          secp256k1_ge_to_bytes(agg_pk->data,&pkp);
          return 1;
        }
        return 1;
      }
      pcVar10 = "test condition failed: !secp256k1_ge_is_infinity(&pkp)";
      uVar4 = 0xd9;
      goto LAB_00108e43;
    }
    pvVar6 = (ctx->illegal_callback).data;
    pcVar10 = "n_pubkeys > 0";
  }
  (*(ctx->illegal_callback).fn)(pcVar10,pvVar6);
  return 0;
}

Assistant:

int secp256k1_musig_pubkey_agg(const secp256k1_context* ctx, secp256k1_xonly_pubkey *agg_pk, secp256k1_musig_keyagg_cache *keyagg_cache, const secp256k1_pubkey * const* pubkeys, size_t n_pubkeys) {
    secp256k1_musig_pubkey_agg_ecmult_data ecmult_data;
    secp256k1_gej pkj;
    secp256k1_ge pkp;
    size_t i;

    VERIFY_CHECK(ctx != NULL);
    if (agg_pk != NULL) {
        memset(agg_pk, 0, sizeof(*agg_pk));
    }
    ARG_CHECK(pubkeys != NULL);
    ARG_CHECK(n_pubkeys > 0);

    ecmult_data.ctx = ctx;
    ecmult_data.pks = pubkeys;

    secp256k1_ge_set_infinity(&ecmult_data.second_pk);
    for (i = 1; i < n_pubkeys; i++) {
        if (secp256k1_memcmp_var(pubkeys[0], pubkeys[i], sizeof(*pubkeys[0])) != 0) {
            secp256k1_ge pk;
            if (!secp256k1_pubkey_load(ctx, &pk, pubkeys[i])) {
                return 0;
            }
            ecmult_data.second_pk = pk;
            break;
        }
    }

    if (!secp256k1_musig_compute_pks_hash(ctx, ecmult_data.pks_hash, pubkeys, n_pubkeys)) {
        return 0;
    }
    /* TODO: actually use optimized ecmult_multi algorithms by providing a
     * scratch space */
    if (!secp256k1_ecmult_multi_var(&ctx->error_callback, NULL, &pkj, NULL, secp256k1_musig_pubkey_agg_callback, (void *) &ecmult_data, n_pubkeys)) {
        /* In order to reach this line with the current implementation of
         * ecmult_multi_var one would need to provide a callback that can
         * fail. */
        return 0;
    }
    secp256k1_ge_set_gej(&pkp, &pkj);
    secp256k1_fe_normalize_var(&pkp.y);
    /* The resulting public key is infinity with negligible probability */
    VERIFY_CHECK(!secp256k1_ge_is_infinity(&pkp));
    if (keyagg_cache != NULL) {
        secp256k1_keyagg_cache_internal cache_i = { 0 };
        cache_i.pk = pkp;
        cache_i.second_pk = ecmult_data.second_pk;
        memcpy(cache_i.pks_hash, ecmult_data.pks_hash, sizeof(cache_i.pks_hash));
        secp256k1_keyagg_cache_save(keyagg_cache, &cache_i);
    }

    if (agg_pk != NULL) {
        secp256k1_extrakeys_ge_even_y(&pkp);
        secp256k1_xonly_pubkey_save(agg_pk, &pkp);
    }
    return 1;
}